

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value
chaiscript::Boxed_Number::binary_go<unsigned_long,float>
          (Opers t_oper,unsigned_long *t,float *u,Boxed_Value *t_lhs)

{
  undefined8 uVar1;
  float *in_RCX;
  ulong uVar2;
  ulong *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar3;
  Boxed_Value *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float local_88;
  float local_70;
  float local_58;
  float local_44;
  
  switch(in_ESI) {
  case 8:
    uVar2 = (ulong)*in_RCX;
    *in_RDX = uVar2 | (long)(*in_RCX - 9.223372e+18) & (long)uVar2 >> 0x3f;
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast
              ((bad_any_cast *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    __cxa_throw(uVar1,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  case 0xb:
    local_44 = (float)*in_RDX;
    uVar2 = (ulong)(local_44 * *in_RCX);
    *in_RDX = uVar2 | (long)(local_44 * *in_RCX - 9.223372e+18) & (long)uVar2 >> 0x3f;
    break;
  case 0xc:
    local_58 = (float)*in_RDX;
    uVar2 = (ulong)(local_58 + *in_RCX);
    *in_RDX = uVar2 | (long)((local_58 + *in_RCX) - 9.223372e+18) & (long)uVar2 >> 0x3f;
    break;
  case 0xd:
    check_divide_by_zero<float>(*in_RCX,(type *)0x0);
    local_70 = (float)*in_RDX;
    uVar2 = (ulong)(local_70 / *in_RCX);
    *in_RDX = uVar2 | (long)(local_70 / *in_RCX - 9.223372e+18) & (long)uVar2 >> 0x3f;
    break;
  case 0xe:
    in_stack_ffffffffffffff64 = *in_RCX;
    local_88 = (float)*in_RDX;
    uVar2 = (ulong)(local_88 - in_stack_ffffffffffffff64);
    *in_RDX = uVar2 | (long)((local_88 - in_stack_ffffffffffffff64) - 9.223372e+18) &
                      (long)uVar2 >> 0x3f;
  }
  Boxed_Value::Boxed_Value
            ((Boxed_Value *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value binary_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign:
            t = u;
            break;
          case Operators::assign_product:
            t *= u;
            break;
          case Operators::assign_sum:
            t += u;
            break;
          case Operators::assign_quotient:
            check_divide_by_zero(u);
            t /= u;
            break;
          case Operators::assign_difference:
            t -= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }